

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::DeInitializeJointActionHistories(PlanningUnitMADPDiscrete *this)

{
  pointer ppTVar1;
  pointer puVar2;
  pointer puVar3;
  
  if (this->_m_jointActionHistoryTreeRoot != (JointActionHistoryTree *)0x0) {
    (*this->_m_jointActionHistoryTreeRoot->_vptr_TreeNode[1])();
  }
  ppTVar1 = (this->_m_jointActionHistoryTreeVector).
            super__Vector_base<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionHistoryTreeVector).
      super__Vector_base<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
    (this->_m_jointActionHistoryTreeVector).
    super__Vector_base<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  }
  this->_m_nrJointActionHistories = 0;
  puVar2 = (this->_m_nrJointActionHistoriesT).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_m_nrJointActionHistoriesT).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_m_nrJointActionHistoriesT).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar3 = (this->_m_firstJAHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_m_firstJAHIforT).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->_m_firstJAHIforT).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::DeInitializeJointActionHistories()
{
    delete _m_jointActionHistoryTreeRoot;//should recursively delet
    _m_jointActionHistoryTreeVector.clear();
    _m_nrJointActionHistories=0;
    _m_nrJointActionHistoriesT.clear();
    _m_firstJAHIforT.clear();    
}